

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

void __thiscall
kj::Exception::Exception(Exception *this,Type type,String *file,int line,String *description)

{
  String *pSVar1;
  char *pcVar2;
  size_t extraout_RDX;
  StringPtr filename;
  StringPtr local_50;
  ArrayPtr<const_char> local_40;
  String *local_30;
  String *description_local;
  String *pSStack_20;
  int line_local;
  String *file_local;
  Exception *pEStack_10;
  Type type_local;
  Exception *this_local;
  
  local_30 = description;
  description_local._4_4_ = line;
  pSStack_20 = file;
  file_local._4_4_ = type;
  pEStack_10 = this;
  pSVar1 = mv<kj::String>(file);
  String::String(&this->ownFile,pSVar1);
  StringPtr::StringPtr(&local_50,&this->ownFile);
  filename.content.size_ = extraout_RDX;
  filename.content.ptr = (char *)local_50.content.size_;
  local_40 = (ArrayPtr<const_char>)trimSourceFilename((kj *)local_50.content.ptr,filename);
  pcVar2 = StringPtr::cStr((StringPtr *)&local_40);
  this->file = pcVar2;
  this->line = description_local._4_4_;
  this->type = file_local._4_4_;
  pSVar1 = mv<kj::String>(description);
  String::String(&this->description,pSVar1);
  Maybe<kj::Own<kj::Exception::Context>_>::Maybe(&this->context);
  this->traceCount = 0;
  return;
}

Assistant:

Exception::Exception(Type type, String file, int line, String description) noexcept
    : ownFile(kj::mv(file)), file(trimSourceFilename(ownFile).cStr()), line(line), type(type),
      description(mv(description)), traceCount(0) {}